

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O3

Int __thiscall
ipx::BasicLu::_Factorize
          (BasicLu *this,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,bool strict_abs_pivottol)

{
  pointer pdVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  logic_error *this_00;
  double *xstore;
  fmtflags floatfield;
  lu_int *Ui;
  undefined7 in_register_00000089;
  Int ncall;
  int c0ntinue;
  bool bVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char local_a9;
  double *local_a8;
  double local_a0;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  
  bVar5 = (int)CONCAT71(in_register_00000089,strict_abs_pivottol) != 0;
  if (bVar5) {
    dVar6 = 1.0;
  }
  else {
    dVar6 = 0.0;
  }
  xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar5) {
    uVar7 = 0xd2f1a9fc;
    uVar8 = 0x3f50624d;
  }
  else {
    uVar7 = 0x86a12b9b;
    uVar8 = 0x3d06849b;
  }
  xstore[0xd] = dVar6;
  xstore[5] = (double)CONCAT44(uVar8,uVar7);
  c0ntinue = 0;
  local_a8 = Bx;
  while( true ) {
    Ui = (this->Ui_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    uVar2 = basiclu_factorize((this->istore_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,xstore,
                              (this->Li_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Lx_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,Ui,
                              (this->Ux_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->Wi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Wx_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,Bbegin,Bend,Bi,local_a8,
                              c0ntinue);
    floatfield = (fmtflags)Ui;
    if (uVar2 != 1) break;
    Reallocate(this);
    c0ntinue = c0ntinue + 1;
    xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if ((uVar2 & 0xfffffffd) == 0) {
    pdVar1 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->fill_factor_ =
         (double)((int)pdVar1[0x4d] + (int)pdVar1[0x4c] + (int)pdVar1[0x40]) /
         (double)(int)pdVar1[100];
    local_98 = pdVar1[0x60];
    local_a0 = pdVar1[0x61];
    local_a8 = (double *)pdVar1[0x6f];
    poVar4 = Control::Debug(this->control_,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," normLinv = ",0xc);
    Format_abi_cxx11_(&local_50,(ipx *)0x0,local_98,2,0x100,floatfield);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
    local_70._M_dataplus._M_p._0_1_ = 0x2c;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," normUinv = ",0xc);
    Format_abi_cxx11_(&local_70,(ipx *)0x0,local_a0,2,0x100,floatfield);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                local_70._M_dataplus._M_p._0_1_),
                        local_70._M_string_length);
    local_90._M_dataplus._M_p._0_1_ = 0x2c;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_90,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," stability = ",0xd);
    Format_abi_cxx11_(&local_90,(ipx *)0x0,(double)local_a8,2,0x100,floatfield);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                                local_90._M_dataplus._M_p._0_1_),
                        local_90._M_string_length);
    local_a9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_a9,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    uVar3 = (1e-12 < (double)local_a8) + 2;
    if (uVar2 != 2) {
      uVar3 = (uint)(1e-12 < (double)local_a8);
    }
    return uVar3;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"basiclu_factorize failed");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Int BasicLu::_Factorize(const Int* Bbegin, const Int* Bend, const Int* Bi,
                        const double* Bx, bool strict_abs_pivottol) {
    Int status;
    if (strict_abs_pivottol) {
        xstore_[BASICLU_REMOVE_COLUMNS] = 1;
        xstore_[BASICLU_ABS_PIVOT_TOLERANCE] = kLuDependencyTol;
    } else {
        xstore_[BASICLU_REMOVE_COLUMNS] = 0;
        xstore_[BASICLU_ABS_PIVOT_TOLERANCE] = 1e-14; // BASICLU default
    }
    for (Int ncall = 0; ; ncall++) {
        status = basiclu_factorize(istore_.data(), xstore_.data(),
                                   Li_.data(), Lx_.data(),
                                   Ui_.data(), Ux_.data(),
                                   Wi_.data(), Wx_.data(),
                                   Bbegin, Bend, Bi, Bx, ncall);
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK && status != BASICLU_WARNING_singular_matrix)
        throw std::logic_error("basiclu_factorize failed");

    Int matrix_nz = xstore_[BASICLU_MATRIX_NZ];
    Int lnz = xstore_[BASICLU_LNZ];
    Int unz = xstore_[BASICLU_UNZ];
    Int dim = xstore_[BASICLU_DIM];
    fill_factor_ = 1.0 * (lnz+unz+dim) / matrix_nz;

    double normLinv = xstore_[BASICLU_NORMEST_LINV];
    double normUinv = xstore_[BASICLU_NORMEST_UINV];
    double stability = xstore_[BASICLU_RESIDUAL_TEST];
    control_.Debug(3)
        << " normLinv = " << sci2(normLinv) << ','
        << " normUinv = " << sci2(normUinv) << ','
        << " stability = " << sci2(stability) << '\n';

    Int ret = 0;
    if (stability > kLuStabilityThreshold)
        ret |= 1;
    if (status == BASICLU_WARNING_singular_matrix)
        ret |= 2;
    return ret;
}